

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Attribute_Access<chaiscript::Boxed_Value,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
::Attribute_Access(Attribute_Access<chaiscript::Boxed_Value,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
                   *this,offset_in_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_to_Boxed_Value
                         t_attr)

{
  Proxy_Function_Base *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffe8;
  
  param_types();
  Proxy_Function_Base::Proxy_Function_Base
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *in_RDI = &PTR__Attribute_Access_005cd618;
  in_RDI[5] = in_RSI;
  return;
}

Assistant:

Attribute_Access(T Class::* t_attr)
          : Proxy_Function_Base(param_types(), 1),
            m_attr(t_attr)
        {
        }